

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowControl.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     jump_far<InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,Context *context)

{
  Registers *pRVar1;
  Segments *pSVar2;
  Source SVar3;
  DataPointer pointer;
  ImmediateT offset;
  type_conflict2 tVar4;
  type_conflict2 tVar5;
  uint32_t uVar6;
  
  pointer = Instruction<false>::destination(instruction);
  SVar3 = pointer.source_;
  if (SVar3 == DirectAddress) {
    offset = Instruction<false>::offset(instruction);
  }
  else if (SVar3 == IndirectNoBase) {
    uVar6 = address<(InstructionSet::x86::Source)23,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                      (instruction,pointer,context);
    offset = (ImmediateT)uVar6;
  }
  else {
    if (SVar3 != Indirect) {
      tVar5 = Instruction<false>::operand(instruction);
      tVar4 = Instruction<false>::offset(instruction);
      goto LAB_00341b73;
    }
    uVar6 = address<(InstructionSet::x86::Source)24,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                      (instruction,pointer,context);
    offset = (ImmediateT)uVar6;
  }
  SVar3 = (Source)(instruction->source_data_dest_sib_ >> 10) & BH | ES;
  tVar4 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (&context->memory,SVar3,offset);
  tVar5 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (&context->memory,SVar3,offset + 2);
LAB_00341b73:
  pRVar1 = (context->flow_controller).registers_;
  pRVar1->cs_ = tVar5;
  pSVar2 = (context->flow_controller).segments_;
  pSVar2->cs_base_ = (uint)pSVar2->registers_->cs_ << 4;
  pRVar1->ip_ = tVar4;
  return;
}

Assistant:

void jump_far(
	InstructionT &instruction,
	ContextT &context
) {
	// TODO: eliminate 16-bit assumption below.
	uint16_t source_address = 0;
	const auto pointer = instruction.destination();
	switch(pointer.source()) {
		default:
		case Source::Immediate:	context.flow_controller.template jump<uint16_t>(instruction.segment(), instruction.offset());	return;

		case Source::Indirect:
			source_address = uint16_t(address<Source::Indirect, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
		case Source::IndirectNoBase:
			source_address = uint16_t(address<Source::IndirectNoBase, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
		case Source::DirectAddress:
			source_address = uint16_t(address<Source::DirectAddress, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
	}

	const Source source_segment = instruction.data_segment();
	context.memory.preauthorise_read(source_segment, source_address, sizeof(uint16_t) * 2);

	const uint16_t offset = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(source_segment, source_address);
	source_address += 2;
	const uint16_t segment = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(source_segment, source_address);
	context.flow_controller.template jump<uint16_t>(segment, offset);
}